

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

int __thiscall deqp::egl::GLES2ThreadTest::FenceSync::init(FenceSync *this,EVP_PKEY_CTX *ctx)

{
  ostream *poVar1;
  int extraout_EAX;
  EGLSyncKHR pvVar2;
  TestError *this_00;
  bool in_DL;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  this->m_display = *(EGLDisplay *)(*(long *)(ctx + 0xb0) + 0x48);
  this->m_serverSync = in_DL;
  deMutex_lock((this->m_lock).m_mutex);
  if (0 < this->m_waiterCount) {
    local_1b0._0_8_ = ctx;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- eglCreateSyncKHR(",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", EGL_SYNC_FENCE_KHR, DE_NULL)",0x1e)
    ;
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    pvVar2 = (EGLSyncKHR)
             (**(code **)(**(long **)(ctx + 0x80) + 0x88))
                       (*(long **)(ctx + 0x80),this->m_display,0x30f9,0);
    this->m_sync = pvVar2;
    local_1b0._0_8_ = ctx;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"End -- ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = eglCreateSyncKHR()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    if (this->m_sync == (EGLSyncKHR)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"m_sync",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                 ,0x12f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  deMutex_unlock((this->m_lock).m_mutex);
  return extraout_EAX;
}

Assistant:

void FenceSync::init (EGLThread& thread, bool serverSync)
{
	m_display		= thread.runtimeContext->display;
	m_serverSync	= serverSync;

	// Use sync only if somebody will actualy depend on it
	m_lock.lock();
	if (m_waiterCount > 0)
	{
		thread.newMessage() << "Begin -- eglCreateSyncKHR(" << ((size_t)m_display) << ", EGL_SYNC_FENCE_KHR, DE_NULL)" << tcu::ThreadUtil::Message::End;
		m_sync = thread.egl.createSyncKHR(m_display, EGL_SYNC_FENCE_KHR, DE_NULL);
		thread.newMessage() << "End -- " << ((size_t)m_sync) << " = eglCreateSyncKHR()" << tcu::ThreadUtil::Message::End;
		TCU_CHECK(m_sync);
	}
	m_lock.unlock();
}